

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Alloc_hider _Var4;
  char *__s;
  pointer pbVar5;
  int iVar6;
  cmValue value;
  cmPropertyMap *pcVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar9;
  string *psVar10;
  ostream *poVar11;
  size_t sVar12;
  pointer ppcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  cmGeneratorTarget *local_368;
  string *local_360;
  undefined1 local_358 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined1 *local_330;
  long local_328;
  undefined1 local_320;
  undefined7 uStack_31f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  string local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  char *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  string local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  char *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string local_230;
  pointer local_210;
  undefined8 local_208;
  ios_base local_1c0 [264];
  char *local_b8;
  pointer local_b0;
  pointer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_368 = tgt;
  local_b8 = defaultValue;
  value = cmGeneratorTarget::GetProperty(tgt,p);
  valueAsString<cmValue>(__return_storage_ptr__,value);
  pcVar7 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_88,pcVar7);
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  pcVar2 = local_368;
  bVar14 = _Var8._M_current !=
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(local_368->LinkImplicitNullProperties)._M_t,p);
  local_2f0 = &(pcVar2->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2e0 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2d8 = _Var8._M_current;
  if ((_Var8._M_current !=
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (local_2e8 != local_2f0)) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar9 = cmGeneratorTarget::GetLinkImplementationClosure(local_368,config);
  if ((pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar10 = cmTarget::GetName_abi_cxx11_(local_368->Target);
    local_230._M_dataplus._M_p = (pointer)0xb;
    local_230._M_string_length = 0x8d7945;
    local_230.field_2._M_allocated_capacity = 0;
    local_210 = (psVar10->_M_dataplus)._M_p;
    local_230.field_2._8_8_ = psVar10->_M_string_length;
    local_208 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_230;
    cmCatViews(&local_2d0,views);
    if (local_2d8 != local_2e0) {
      std::__cxx11::string::append((char *)&local_2d0);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_250 = &local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      if (local_250 == &local_240) {
        local_230.field_2._8_8_ = local_240._8_8_;
        local_250 = &local_230.field_2;
      }
      local_230.field_2._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
      local_230.field_2._M_local_buf[0] = local_240._M_local_buf[0];
      local_230._M_string_length = (size_type)local_248;
      local_248 = (char *)0x0;
      local_240._M_local_buf[0] = '\0';
      local_230._M_dataplus._M_p = (pointer)local_250;
      local_250 = &local_240;
      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,
                        CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0]) +
                        1);
      }
    }
    std::__cxx11::string::append((char *)&local_2d0);
    std::operator+(&local_50,"INTERFACE_",p);
    local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    iVar6 = std::__cxx11::string::compare((char *)p);
    if (iVar6 == 0) {
      local_358._0_8_ = local_368->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                 (cmGeneratorTarget **)config);
      _Var4._M_p = local_230._M_dataplus._M_p;
      __ptr = local_370;
      local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p;
      local_230._M_dataplus._M_p = (pointer)0x0;
      if ((__ptr != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) &&
         (std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                    ((default_delete<cmGeneratorExpressionInterpreter> *)&local_370,
                     (cmGeneratorExpressionInterpreter *)__ptr),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_230._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)&local_230,
                   (cmGeneratorExpressionInterpreter *)local_230._M_dataplus._M_p);
      }
    }
    ppcVar13 = (pvVar9->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (pvVar9->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_360 = p;
    if (ppcVar13 != local_b0) {
      bVar15 = local_2e8 != local_2f0;
      bVar16 = local_2d8 == local_2e0;
      do {
        pcVar2 = *ppcVar13;
        local_a8 = ppcVar13;
        pcVar7 = cmTarget::GetProperties(pcVar2->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_a0,pcVar7);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar5 = local_a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>
                  (&local_290,pcVar2,&local_50,(cmGeneratorExpressionInterpreter *)local_370);
        pbVar3 = local_2d8;
        local_330 = &local_320;
        local_328 = 0;
        local_320 = 0;
        if (_Var8._M_current == pbVar5) {
          iVar6 = 3;
          if (bVar16 && bVar15) {
LAB_0059d37a:
            local_70[0] = local_60;
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            local_230._M_string_length = 0;
            local_230.field_2._M_allocated_capacity =
                 local_230.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            if (_Var8._M_current != pbVar5) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_358,__return_storage_ptr__,&local_290,t);
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
              __s = local_b8;
              sVar12 = __return_storage_ptr__->_M_string_length;
              bVar17 = true;
              if (sVar12 == local_358._16_8_) {
                if (sVar12 == 0) {
                  bVar17 = false;
                }
                else {
                  iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                               sVar12);
                  bVar17 = iVar6 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_(&local_230,t,bVar17);
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if (local_358[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"Property ",9);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_230,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
                psVar10 = cmTarget::GetName_abi_cxx11_(local_368->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is\nimplied to be ",0x13);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar12 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," property on\ndependency \"",0x19);
                psVar10 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_310);
                goto LAB_0059d8d7;
              }
              iVar6 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_0059d91b;
            }
            iVar6 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_330);
          psVar10 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
          std::__cxx11::string::_M_append((char *)&local_330,(ulong)(psVar10->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_330);
          local_2b0 = &local_2a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,local_290._M_dataplus._M_p,
                     local_290._M_dataplus._M_p + local_290._M_string_length);
          if (local_2b0 == &local_2a0) {
            local_230.field_2._8_8_ = local_2a0._8_8_;
            local_2b0 = &local_230.field_2;
          }
          local_230.field_2._M_allocated_capacity._1_7_ = local_2a0._M_allocated_capacity._1_7_;
          local_230.field_2._M_local_buf[0] = local_2a0._M_local_buf[0];
          local_230._M_string_length = (size_type)local_2a8;
          local_2a8 = (char *)0x0;
          local_2a0._M_local_buf[0] = '\0';
          local_230._M_dataplus._M_p = (pointer)local_2b0;
          local_2b0 = &local_2a0;
          std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_230._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if (local_2b0 != &local_2a0) {
            operator_delete(local_2b0,
                            CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]
                                    ) + 1);
          }
          std::__cxx11::string::append((char *)&local_330);
          if (pbVar3 == local_2e0) {
            if (local_2e8 != local_2f0) goto LAB_0059d37a;
            if (bVar14) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_358,__return_storage_ptr__,&local_290,t);
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
              sVar12 = __return_storage_ptr__->_M_string_length;
              bVar14 = true;
              if (sVar12 == local_358._16_8_) {
                if (sVar12 == 0) {
                  bVar14 = false;
                }
                else {
                  iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                               sVar12);
                  bVar14 = iVar6 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_(&local_230,t,bVar14);
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if (local_358[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"The INTERFACE_",0xe);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_230,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," property of \"",0xe);
                psVar10 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" does\nnot agree with the value of ",0x23);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," already determined\nfor \"",0x19);
                psVar10 = cmTarget::GetName_abi_cxx11_(local_368->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_allocated_capacity != &local_300) {
                  operator_delete((void *)local_310._M_allocated_capacity,
                                  local_300._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
                std::ios_base::~ios_base(local_1c0);
                iVar6 = 2;
              }
              else {
                iVar6 = 3;
                std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._8_8_ != &local_340) {
                operator_delete((void *)local_358._8_8_,local_340._0_8_ + 1);
              }
              bVar14 = true;
            }
            else {
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_230,local_330,local_330 + local_328);
              std::__cxx11::string::append((char *)&local_230);
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              bVar14 = true;
              iVar6 = 0;
            }
          }
          else {
            consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_358,__return_storage_ptr__,&local_290,t);
            std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
            sVar12 = __return_storage_ptr__->_M_string_length;
            bVar17 = true;
            if (sVar12 == local_358._16_8_) {
              if (sVar12 == 0) {
                bVar17 = false;
              }
              else {
                iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                             sVar12);
                bVar17 = iVar6 != 0;
              }
            }
            compatibilityAgree_abi_cxx11_(&local_230,t,bVar17);
            std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_358[0] == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"Property ",9);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_230,(local_360->_M_dataplus)._M_p,
                                   local_360->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
              psVar10 = cmTarget::GetName_abi_cxx11_(local_368->Target);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" does\nnot match the INTERFACE_",0x1f);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(local_360->_M_dataplus)._M_p,local_360->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," property requirement\nof dependency \"",0x25);
              psVar10 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((string *)&local_310);
LAB_0059d8d7:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_allocated_capacity != &local_300) {
                operator_delete((void *)local_310._M_allocated_capacity,
                                local_300._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
              std::ios_base::~ios_base(local_1c0);
              iVar6 = 2;
            }
            else {
              iVar6 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
LAB_0059d91b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._8_8_ != &local_340) {
              operator_delete((void *)local_358._8_8_,local_340._0_8_ + 1);
            }
          }
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,CONCAT71(uStack_31f,local_320) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
      } while (((iVar6 == 3) || (iVar6 == 0)) && (ppcVar13 = local_a8 + 1, ppcVar13 != local_b0));
    }
    pcVar2 = local_368;
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_270 = &local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    psVar10 = local_360;
    if (local_270 == &local_260) {
      local_230.field_2._8_8_ = local_260._8_8_;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230._M_dataplus._M_p = (pointer)local_270;
    }
    local_230.field_2._M_allocated_capacity._1_7_ = local_260._1_7_;
    local_230.field_2._M_local_buf[0] = local_260._M_local_buf[0];
    local_230._M_string_length = local_268;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_270 = &local_260;
    compatibilityType_abi_cxx11_((string *)local_358,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar2,psVar10,&local_230,&local_2d0,(string *)local_358);
    if ((cmLocalGenerator *)local_358._0_8_ != (cmLocalGenerator *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,CONCAT71(local_260._1_7_,local_260._M_local_buf[0]) + 1);
    }
    if (local_370 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_370,
                 (cmGeneratorExpressionInterpreter *)local_370);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}